

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 *puVar6;
  undefined8 *puVar7;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int adj_byte;
  int decrement_arg;
  int carry;
  int j;
  uchar seq [8];
  uchar adjusted_iv [8];
  gost_ctx *c_1;
  ossl_gost_cipher_ctx *ctr_ctx;
  int mode;
  uchar newkey [32];
  ossl_gost_cipher_ctx *c;
  byte *in_stack_ffffffffffffff68;
  gost_ctx *in_stack_ffffffffffffff70;
  uint local_78;
  int local_74;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  long local_60;
  long local_58;
  int local_4c;
  undefined8 *local_20;
  int local_18;
  undefined8 local_10;
  int local_4;
  
  if (in_ESI == 6) {
    uVar1 = EVP_CIPHER_CTX_get_key_length(in_RDI);
    iVar2 = RAND_priv_bytes(in_RCX,uVar1);
    if (iVar2 < 1) {
      ERR_GOST_error((int)((ulong)in_RCX >> 0x20),(int)in_RCX,(char *)in_stack_ffffffffffffff68,0);
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_18 = in_EDX;
    if (in_ESI == 0x20) {
      lVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
      if (lVar4 == 0) {
        local_4 = -1;
      }
      else if (*(int *)(lVar4 + 4) == 0) {
        *(int *)(lVar4 + 8) = local_18;
        local_4 = 1;
      }
      else {
        local_4 = -1;
      }
    }
    else if (in_ESI == 0x2a) {
      local_20 = in_RCX;
      local_10 = in_RDI;
      uVar5 = EVP_CIPHER_CTX_get0_cipher(in_RDI);
      local_4c = EVP_CIPHER_get_mode(uVar5);
      local_58 = 0;
      local_60 = 0;
      if (local_4c == 5) {
        local_58 = EVP_CIPHER_CTX_get_cipher_data(local_10);
        local_60 = local_58 + 0x1c;
        local_70 = *local_20;
        iVar2 = decrement_sequence((uchar *)&local_70,local_18);
        if (iVar2 == 0) {
          ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                         (int)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,0);
          local_4 = -1;
        }
        else {
          iVar2 = gost_tlstree((int)ctr_ctx,(uchar *)c_1,(uchar *)adjusted_iv,(uchar *)seq);
          if (iVar2 < 1) {
            local_4 = -1;
          }
          else {
            memset(&local_68,0,8);
            puVar6 = (undefined4 *)EVP_CIPHER_CTX_original_iv(local_10);
            local_68 = *puVar6;
            local_78 = 0;
            for (local_74 = 3; -1 < local_74; local_74 = local_74 + -1) {
              uVar3 = (uint)*(byte *)((long)&local_68 + (long)local_74) +
                      (uint)*(byte *)((long)&local_70 + (long)(local_74 + 4)) + local_78;
              local_78 = (uint)(0xff < uVar3);
              *(char *)((long)&local_68 + (long)local_74) = (char)uVar3;
            }
            EVP_CIPHER_CTX_set_num(local_10,0);
            puVar7 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(local_10);
            *puVar7 = CONCAT44(uStack_64,local_68);
            magma_key(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            local_4 = 1;
          }
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
                     (char *)in_stack_ffffffffffffff68,0);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int magma_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
    case EVP_CTRL_KEY_MESH:
        {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            c->key_meshing = arg;
            return 1;
        }
    case EVP_CTRL_TLSTREE:
        {
            unsigned char newkey[32];
            int mode = EVP_CIPHER_CTX_mode(ctx);
            struct ossl_gost_cipher_ctx *ctr_ctx = NULL;
            gost_ctx *c = NULL;

            unsigned char adjusted_iv[8];
            unsigned char seq[8];
            int j, carry, decrement_arg;
            if (mode != EVP_CIPH_CTR_MODE)
                return -1;

            ctr_ctx = (struct ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
            c = &(ctr_ctx->cctx);

            /*
             * 'arg' parameter indicates what we should do with sequence value.
             * 
             * When function called, seq is incremented after MAC calculation.
             * In ETM mode, we use seq 'as is' in the ctrl-function (arg = 0)
             * Otherwise we have to decrease it in the implementation (arg = 1).
             */
            memcpy(seq, ptr, 8);
            decrement_arg = arg;
            if(!decrement_sequence(seq, decrement_arg)) {
                GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_CTRL_CALL_FAILED);
                return -1;
            }

            if (gost_tlstree(NID_magma_cbc, (const unsigned char *)c->master_key, newkey,
                             (const unsigned char *)seq) > 0) {
                memset(adjusted_iv, 0, 8);
                memcpy(adjusted_iv, EVP_CIPHER_CTX_original_iv(ctx), 4);
                for (j = 3, carry = 0; j >= 0; j--)
                {
                    int adj_byte = adjusted_iv[j] + seq[j+4] + carry;
                    carry = (adj_byte > 255) ? 1 : 0;
                    adjusted_iv[j] = adj_byte & 0xFF;
                }
                EVP_CIPHER_CTX_set_num(ctx, 0);
                memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), adjusted_iv, 8);

                magma_key(c, newkey);
                return 1;
          }
        }
        return -1;
    default:
        GOSTerr(GOST_F_MAGMA_CIPHER_CTL, GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}